

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bstrListAlloc(bstrList *sl,int msz)

{
  ulong __size;
  uint uVar1;
  bstring *pptVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((((0 < msz && sl != (bstrList *)0x0) && (pptVar2 = sl->entry, pptVar2 != (bstring *)0x0)) &&
      (-1 < sl->qty)) && (uVar1 = sl->mlen, sl->qty <= (int)uVar1 && 0 < (int)uVar1)) {
    if (uVar1 < (uint)msz) {
      uVar1 = snapUpSize(msz);
      __size = (ulong)uVar1 * 8;
      if (__size < uVar1) {
        return -1;
      }
      pptVar2 = (bstring *)realloc(pptVar2,__size);
      if ((pptVar2 == (bstring *)0x0) &&
         (pptVar2 = (bstring *)realloc(sl->entry,(ulong)(uint)msz << 3), uVar1 = msz,
         pptVar2 == (bstring *)0x0)) {
        return -1;
      }
      sl->mlen = uVar1;
      sl->entry = pptVar2;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int bstrListAlloc (struct bstrList * sl, int msz) {
bstring * l;
int smsz;
size_t nsz;
	if (!sl || msz <= 0 || !sl->entry || sl->qty < 0 || sl->mlen <= 0 ||
	    sl->qty > sl->mlen) return BSTR_ERR;
	if (sl->mlen >= msz) return BSTR_OK;
	smsz = snapUpSize (msz);
	nsz = ((size_t) smsz) * sizeof (bstring);
	if (nsz < (size_t) smsz) return BSTR_ERR;
	l = (bstring *) bstr__realloc (sl->entry, nsz);
	if (!l) {
		smsz = msz;
		nsz = ((size_t) smsz) * sizeof (bstring);
		l = (bstring *) bstr__realloc (sl->entry, nsz);
		if (!l) return BSTR_ERR;
	}
	sl->mlen = smsz;
	sl->entry = l;
	return BSTR_OK;
}